

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

void gprefs_from_str(char *str,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *ptr;
  uint secondary;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  char *__s2;
  
  ptr = dupstr(str);
  secondary = 0;
  uVar9 = 0;
  pcVar2 = ptr;
  pcVar8 = ptr;
  do {
    do {
      while( true ) {
        __s2 = pcVar2;
        cVar1 = *__s2;
        if (cVar1 != ',') break;
        pcVar2 = __s2 + 1;
        pcVar8 = pcVar8 + 1;
      }
      pcVar8 = pcVar8 + 1;
      if (cVar1 == '\0') {
        safefree(ptr);
        do {
          do {
            if (nvals <= (int)secondary) {
              return;
            }
          } while (nvals < 1);
          uVar7 = 0;
          do {
            uVar4 = mapping[uVar7].v;
            if ((int)uVar4 < 0) {
              __assert_fail("mapping[i].v >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                            ,0x182,
                            "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                           );
            }
            if (0x1f < uVar4) {
              __assert_fail("mapping[i].v < 32",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                            ,0x183,
                            "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                           );
            }
            if ((uVar9 & 1 << ((byte)uVar4 & 0x1f)) == 0) {
              uVar4 = secondary;
              if (mapping[uVar7].vrel == -1) {
                uVar6 = mapping[uVar7].where >> 0x1f & secondary;
              }
              else {
                if ((uVar9 & 1 << ((byte)mapping[uVar7].vrel & 0x1f)) == 0) goto LAB_00140915;
                if ((int)secondary < 1) {
LAB_00140939:
                  __assert_fail("j < n",
                                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                                ,0x197,
                                "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                               );
                }
                uVar6 = 0;
                while (iVar3 = conf_get_int_int(conf,primary,uVar6), iVar3 != mapping[uVar7].vrel) {
                  uVar6 = uVar6 + 1;
                  if (secondary == uVar6) goto LAB_00140939;
                }
                uVar6 = uVar6 - (~mapping[uVar7].where >> 0x1f);
              }
              while ((int)uVar6 < (int)uVar4) {
                iVar3 = conf_get_int_int(conf,primary,uVar4 - 1);
                conf_set_int_int(conf,primary,uVar4,iVar3);
                uVar4 = uVar4 - 1;
              }
              conf_set_int_int(conf,primary,uVar6,mapping[uVar7].v);
              uVar9 = uVar9 | 1 << ((byte)mapping[uVar7].v & 0x1f);
              secondary = secondary + 1;
            }
LAB_00140915:
            uVar7 = uVar7 + 1;
          } while (uVar7 != (uint)nvals);
        } while( true );
      }
      while (cVar1 != '\0') {
        if (cVar1 == ',') {
          pcVar8[-1] = '\0';
          goto LAB_0014072a;
        }
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      }
      pcVar8 = pcVar8 + -1;
LAB_0014072a:
      pcVar2 = pcVar8;
    } while (nvals < 1);
    lVar5 = 0;
    do {
      iVar3 = strcmp(*(char **)((long)&mapping->s + lVar5),__s2);
      if (iVar3 == 0) {
        iVar3 = *(int *)((long)&mapping->v + lVar5);
        if ((iVar3 != -1) && (uVar4 = 1 << ((byte)iVar3 & 0x1f), (uVar9 & uVar4) == 0)) {
          uVar9 = uVar9 | uVar4;
          conf_set_int_int(conf,primary,secondary,iVar3);
          secondary = secondary + 1;
        }
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uint)nvals * 0x18 != lVar5);
  } while( true );
}

Assistant:

static void gprefs_from_str(const char *str,
                            const struct keyvalwhere *mapping, int nvals,
                            Conf *conf, int primary)
{
    char *commalist = dupstr(str);
    char *p, *q;
    int i, j, n, v, pos;
    unsigned long seen = 0;            /* bitmap for weeding dups etc */

    /*
     * Go through that list and convert it into values.
     */
    n = 0;
    p = commalist;
    while (1) {
        while (*p && *p == ',') p++;
        if (!*p)
            break;                     /* no more words */

        q = p;
        while (*p && *p != ',') p++;
        if (*p) *p++ = '\0';

        v = key2val(mapping, nvals, q);
        if (v != -1 && !(seen & (1 << v))) {
            seen |= (1 << v);
            conf_set_int_int(conf, primary, n, v);
            n++;
        }
    }

    sfree(commalist);

    /*
     * Now go through 'mapping' and add values that weren't mentioned
     * in the list we fetched. We may have to loop over it multiple
     * times so that we add values before other values whose default
     * positions depend on them.
     */
    while (n < nvals) {
        for (i = 0; i < nvals; i++) {
            assert(mapping[i].v >= 0);
            assert(mapping[i].v < 32);

            if (!(seen & (1 << mapping[i].v))) {
                /*
                 * This element needs adding. But can we add it yet?
                 */
                if (mapping[i].vrel != -1 && !(seen & (1 << mapping[i].vrel)))
                    continue;          /* nope */

                /*
                 * OK, we can work out where to add this element, so
                 * do so.
                 */
                if (mapping[i].vrel == -1) {
                    pos = (mapping[i].where < 0 ? n : 0);
                } else {
                    for (j = 0; j < n; j++)
                        if (conf_get_int_int(conf, primary, j) ==
                            mapping[i].vrel)
                            break;
                    assert(j < n);     /* implied by (seen & (1<<vrel)) */
                    pos = (mapping[i].where < 0 ? j : j+1);
                }

                /*
                 * And add it.
                 */
                for (j = n-1; j >= pos; j--)
                    conf_set_int_int(conf, primary, j+1,
                                     conf_get_int_int(conf, primary, j));
                conf_set_int_int(conf, primary, pos, mapping[i].v);
                seen |= (1 << mapping[i].v);
                n++;
            }
        }
    }
}